

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# array.h
# Opt level: O3

void __thiscall
kj::ArrayBuilder<capnp::compiler::CompilerMain::OutputDirective>::~ArrayBuilder
          (ArrayBuilder<capnp::compiler::CompilerMain::OutputDirective> *this)

{
  OutputDirective *pOVar1;
  RemoveConst<capnp::compiler::CompilerMain::OutputDirective> *pRVar2;
  OutputDirective *pOVar3;
  
  pOVar1 = this->ptr;
  if (pOVar1 != (OutputDirective *)0x0) {
    pRVar2 = this->pos;
    pOVar3 = this->endPtr;
    this->ptr = (OutputDirective *)0x0;
    this->pos = (RemoveConst<capnp::compiler::CompilerMain::OutputDirective> *)0x0;
    this->endPtr = (OutputDirective *)0x0;
    (**this->disposer->_vptr_ArrayDisposer)
              (this->disposer,pOVar1,0x30,((long)pRVar2 - (long)pOVar1 >> 4) * -0x5555555555555555,
               ((long)pOVar3 - (long)pOVar1 >> 4) * -0x5555555555555555,
               ArrayDisposer::Dispose_<capnp::compiler::CompilerMain::OutputDirective>::destruct);
    return;
  }
  return;
}

Assistant:

inline void dispose() {
    // Make sure that if an exception is thrown, we are left with a null ptr, so we won't possibly
    // dispose again.
    T* ptrCopy = ptr;
    T* posCopy = pos;
    T* endCopy = endPtr;
    if (ptrCopy != nullptr) {
      ptr = nullptr;
      pos = nullptr;
      endPtr = nullptr;
      disposer->dispose(ptrCopy, posCopy - ptrCopy, endCopy - ptrCopy);
    }
  }